

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme.cpp
# Opt level: O1

string * __thiscall
psy::C::Lexeme::value<std::__cxx11::string>(string *__return_storage_ptr__,Lexeme *this)

{
  string p;
  allocator<char> local_31;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,*(char **)&this->field_0x10,&local_31);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,(long)local_30 + 1,(long)local_30 + local_28 + -1);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexeme::value<std::string>() const
{
    auto p = valueText();
    return std::string(p.c_str() + 1, p.size() - 2);
}